

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::nextOverlap
          (overlap_iterator *this)

{
  uint32_t *puVar1;
  uint32_t size;
  uint uVar2;
  pointer pEVar3;
  uint32_t uVar4;
  uint uVar5;
  size_type sVar6;
  
  sVar6 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((int)sVar6 != 1) {
    uVar5 = (int)(this->super_iterator).super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 2;
    do {
      (this->super_iterator).super_const_iterator.path.path.
      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = sVar6 - 1;
      pEVar3 = (this->super_iterator).super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      size = pEVar3[sVar6 - 2].size;
      uVar2 = pEVar3[sVar6 - 2].offset;
      if (uVar2 < size - 1) {
        if (uVar5 == 0) {
          uVar4 = IntervalMapDetails::
                  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_>
                  ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_>
                                      *)pEVar3->node,uVar2 + 1,size,&this->searchKey);
        }
        else {
          uVar4 = IntervalMapDetails::
                  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                  ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                                      *)pEVar3[uVar5].node,uVar2 + 1,size,&this->searchKey);
        }
        pEVar3[sVar6 - 2].offset = uVar4;
        if (uVar4 != size) {
          treeFind(this);
          return;
        }
      }
      sVar6 = (this->super_iterator).super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
      uVar5 = uVar5 - 1;
    } while ((int)sVar6 != 1);
  }
  puVar1 = &(this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[sVar6 - 1].offset;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::nextOverlap() {
    auto& path = this->path;
    SLANG_ASSERT(path.leafOffset() == path.leafSize());
    SLANG_ASSERT(valid());

    // Pop up a level and try to move forward. Keep going until we
    // find a new branch that overlaps our target key.
    uint32_t l = path.height();
    while (path.height()) {
        path.pop();
        --l;

        uint32_t& offset = path.leafOffset();
        uint32_t size = path.leafSize();
        if (offset < size - 1) {
            offset = l == 0 ? path.template node<RootBranch>(l).findFirstOverlap(offset + 1, size,
                                                                                 searchKey)
                            : path.template node<Branch>(l).findFirstOverlap(offset + 1, size,
                                                                             searchKey);
            if (offset != size) {
                // Descend back down to the next overlapping leaf node from our current position.
                treeFind();
                return;
            }
        }
    }

    // If we hit this point we ran out places to look. We should be right
    // before the last node in the root branch so bump our offset by one
    // to make the path point to the end of the tree.
    SLANG_ASSERT(path.height() == 0);
    path.leafOffset()++;
}